

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

int is_u8_zstring_latin1(char *in)

{
  char *pcVar1;
  char *pcStack_18;
  uint c;
  char *in_local;
  
  pcVar1 = in;
  while( true ) {
    do {
      pcStack_18 = pcVar1;
      if (*pcStack_18 == '\0') {
        return 1;
      }
      pcVar1 = pcStack_18 + 1;
    } while ((uint)(int)*pcStack_18 < 0x80);
    if (((int)*pcStack_18 & 0xfcU) != 0xc0) break;
    pcVar1 = pcStack_18 + 2;
    if (((int)pcStack_18[1] & 0xc0U) != 0x80) {
      return 0;
    }
  }
  return 0;
}

Assistant:

static int
is_u8_zstring_latin1(const char *in)
{
	unsigned int c;
	while (*in) {
		c = *in++;
		if (c < 0x80) continue;
		/*
		 * Filter out non-continuation, any continuation of 2-3
		 * bytes, and any continuation of 1 byte whose high 3 bits
		 * are non-zero. Recall, 1-byte continuations can store 11
		 * bits whereas Latin-1 codepoints are only 8 bits wide.
		 */
		if ((c & 0xFC) != 0xC0)
			return (0);
		c = *in++;
		/*
		 * If we get any non-continuation byte (including 0x00!),
		 * the string is not valid UTF-8.
		 */
		if ((c & 0xC0) != 0x80)
			return (0); /* invalid unicode */
	}
	return (1);
}